

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_VecStr.cpp
# Opt level: O0

void __thiscall
mbc::Val::VecStr::VecStr
          (VecStr *this,
          function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *vaild_checker)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  allocator local_49;
  string local_48;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *local_18;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *vaild_checker_local;
  VecStr *this_local;
  
  local_18 = vaild_checker;
  vaild_checker_local =
       (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        *)this;
  _ValAtom::_ValAtom(&this->super__ValAtom);
  (this->super__ValAtom).super_ValBase._vptr_ValBase = (_func_int **)&PTR__VecStr_00192a08;
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)operator_new(0x18);
  (this_00->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(this_00);
  this->value_ = this_00;
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator=((this->super__ValAtom).vaild_checker_,vaild_checker);
  std::__cxx11::string::operator=
            ((string *)(this->super__ValAtom).super_ValBase.invaild_waring_,"[invaild vecstr]");
  *(this->super__ValAtom).super_ValBase.type_ = VECSTR;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"[]",&local_49);
  _ValAtom::set(&this->super__ValAtom,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

VecStr::VecStr(std::function<bool(const std::string&)> vaild_checker) : _ValAtom() {
    value_          = new vector<string>();

    *vaild_checker_  = vaild_checker;
    *invaild_waring_ = "[invaild vecstr]";
    *type_           = Type(VECSTR);

    set("[]");
}